

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O0

void __thiscall soplex::DIdxSet::DIdxSet(DIdxSet *this,DIdxSet *old)

{
  int iVar1;
  IdxSet *in_RSI;
  IdxSet *in_RDI;
  int in_stack_0000000c;
  int **in_stack_00000010;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe4;
  
  IdxSet::IdxSet(in_RDI);
  in_RDI->_vptr_IdxSet = (_func_int **)&PTR__DIdxSet_004ea6f8;
  iVar1 = IdxSet::size(in_RSI);
  in_RDI->len = iVar1;
  if (in_RDI->len < 1) {
    local_2c = 1;
  }
  else {
    local_2c = in_RDI->len;
  }
  in_RDI->len = local_2c;
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  IdxSet::operator=((IdxSet *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),in_RDI);
  return;
}

Assistant:

DIdxSet::DIdxSet(const DIdxSet& old)
   : IdxSet()
{
   len = old.size();
   len = (len < 1) ? 1 : len;
   spx_alloc(idx, len);

   IdxSet::operator= (old);
}